

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O0

int Min_CubesAreEqual(Min_Cube_t *pCube0,Min_Cube_t *pCube1)

{
  int local_24;
  int i;
  Min_Cube_t *pCube1_local;
  Min_Cube_t *pCube0_local;
  
  local_24 = 0;
  while( true ) {
    if ((int)(*(uint *)&pCube0->field_0x8 >> 10 & 0xfff) <= local_24) {
      return 1;
    }
    if (pCube0->uData[local_24] != pCube1->uData[local_24]) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

static inline int Min_CubesAreEqual( Min_Cube_t * pCube0, Min_Cube_t * pCube1 )
{
    int i;
    for ( i = 0; i < (int)pCube0->nWords; i++ )
        if ( pCube0->uData[i] != pCube1->uData[i] )
            return 0;
    return 1;
}